

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateTypeDefinition(ExpressionTranslateContext *ctx,TypeBase *type)

{
  TypeFunction *pTVar1;
  TypeArray *pTVar2;
  TypeClass *type_00;
  TypeEnum *pTVar3;
  TypeEnum *typeEnum;
  MemberHandle *curr_1;
  uint index;
  uint offset;
  MemberHandle *curr;
  TypeClass *typeClass;
  TypeArray *typeArray;
  TypeFunction *typeFunction;
  TypeBase *type_local;
  ExpressionTranslateContext *ctx_local;
  
  if (((type->hasTranslation & 1U) == 0) &&
     (type->hasTranslation = true, (type->isGeneric & 1U) == 0)) {
    pTVar1 = getType<TypeFunction>(type);
    if (pTVar1 == (TypeFunction *)0x0) {
      pTVar2 = getType<TypeArray>(type);
      if (pTVar2 == (TypeArray *)0x0) {
        type_00 = getType<TypeClass>(type);
        if (type_00 == (TypeClass *)0x0) {
          pTVar3 = getType<TypeEnum>(type);
          if (pTVar3 != (TypeEnum *)0x0) {
            Print(ctx,"struct ");
            PrintEscapedName(ctx,(pTVar3->super_TypeStruct).super_TypeBase.name);
            PrintLine(ctx);
            PrintIndentedLine(ctx,"{");
            ctx->depth = ctx->depth + 1;
            PrintIndent(ctx);
            PrintEscapedName(ctx,(pTVar3->super_TypeStruct).super_TypeBase.name);
            Print(ctx,"(): value(0){}");
            PrintLine(ctx);
            PrintIndent(ctx);
            PrintEscapedName(ctx,(pTVar3->super_TypeStruct).super_TypeBase.name);
            Print(ctx,"(int v): value(v){}");
            PrintLine(ctx);
            PrintIndentedLine(ctx,"int value;");
            ctx->depth = ctx->depth - 1;
            PrintIndentedLine(ctx,"};");
          }
        }
        else if ((((type_00->super_TypeStruct).super_TypeBase.importModule == (ModuleData *)0x0) ||
                 ((type_00->isInternal & 1U) == 0)) && ((type_00->completed & 1U) != 0)) {
          for (_index = (type_00->super_TypeStruct).members.head; _index != (MemberHandle *)0x0;
              _index = _index->next) {
            TranslateTypeDefinition(ctx,_index->variable->type);
          }
          Print(ctx,"struct ");
          PrintEscapedTypeName(ctx,(TypeBase *)type_00);
          PrintLine(ctx);
          PrintIndentedLine(ctx,"{");
          ctx->depth = ctx->depth + 1;
          curr_1._4_4_ = 0;
          curr_1._0_4_ = 0;
          for (typeEnum = (TypeEnum *)(type_00->super_TypeStruct).members.head;
              typeEnum != (TypeEnum *)0x0;
              typeEnum = (TypeEnum *)(typeEnum->super_TypeStruct).super_TypeBase.name.end) {
            if (curr_1._4_4_ <
                *(uint *)(*(long *)&(typeEnum->super_TypeStruct).super_TypeBase.typeID + 0x3c)) {
              PrintIndentedLine(ctx,"char pad_%d[%d];",(ulong)(uint)curr_1,
                                (ulong)(*(int *)(*(long *)&(typeEnum->super_TypeStruct).
                                                           super_TypeBase.typeID + 0x3c) -
                                       curr_1._4_4_));
            }
            PrintIndent(ctx);
            TranslateTypeName(ctx,*(TypeBase **)
                                   (*(long *)&(typeEnum->super_TypeStruct).super_TypeBase.typeID +
                                   0x20));
            Print(ctx," ");
            TranslateVariableName
                      (ctx,*(VariableData **)&(typeEnum->super_TypeStruct).super_TypeBase.typeID);
            Print(ctx,";");
            PrintLine(ctx);
            curr_1._4_4_ = *(int *)(*(long *)&(typeEnum->super_TypeStruct).super_TypeBase.typeID +
                                   0x3c) +
                           (int)*(undefined8 *)
                                 (*(long *)(*(long *)&(typeEnum->super_TypeStruct).super_TypeBase.
                                                      typeID + 0x20) + 0x30);
            curr_1._0_4_ = (uint)curr_1 + 1;
          }
          if ((type_00->super_TypeStruct).super_TypeBase.padding != 0) {
            PrintIndentedLine(ctx,"char pad_%d[%d];",(ulong)(uint)curr_1,
                              (ulong)(type_00->super_TypeStruct).super_TypeBase.padding);
          }
          ctx->depth = ctx->depth - 1;
          PrintIndentedLine(ctx,"};");
        }
      }
      else {
        TranslateTypeDefinition(ctx,pTVar2->subType);
        Print(ctx,"struct ");
        PrintEscapedName(ctx,(pTVar2->super_TypeBase).name);
        PrintLine(ctx);
        PrintIndentedLine(ctx,"{");
        ctx->depth = ctx->depth + 1;
        PrintIndent(ctx);
        TranslateTypeName(ctx,pTVar2->subType);
        Print(ctx," ptr[%lld];",
              pTVar2->length + (4U - (pTVar2->length * pTVar2->subType->size) % 4 & 3));
        PrintLine(ctx);
        PrintIndent(ctx);
        PrintEscapedName(ctx,(pTVar2->super_TypeBase).name);
        Print(ctx,"& set(unsigned index, ");
        TranslateTypeName(ctx,pTVar2->subType);
        Print(ctx," const& val){ ptr[index] = val; return *this; }");
        PrintLine(ctx);
        PrintIndent(ctx);
        TranslateTypeName(ctx,pTVar2->subType);
        Print(ctx,
              "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }"
              ,pTVar2->length & 0xffffffff);
        PrintLine(ctx);
        ctx->depth = ctx->depth - 1;
        PrintIndentedLine(ctx,"};");
      }
    }
    else {
      Print(ctx,"struct __typeProxy_");
      PrintEscapedName(ctx,(pTVar1->super_TypeBase).name);
      Print(ctx,"{};");
      PrintLine(ctx);
    }
  }
  return;
}

Assistant:

void TranslateTypeDefinition(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(type->hasTranslation)
		return;

	type->hasTranslation = true;

	if(type->isGeneric)
		return;

	if(TypeFunction *typeFunction = getType<TypeFunction>(type))
	{
		Print(ctx, "struct __typeProxy_");
		PrintEscapedName(ctx, typeFunction->name);
		Print(ctx, "{};");
		PrintLine(ctx);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		TranslateTypeDefinition(ctx, typeArray->subType);

		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeArray->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " ptr[%lld];", typeArray->length + ((4 - (typeArray->length * typeArray->subType->size % 4)) & 3)); // Round total byte size to 4
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeArray->name);
		Print(ctx, "& set(unsigned index, ");
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " const& val){ ptr[index] = val; return *this; }");
		PrintLine(ctx);

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }", (unsigned)typeArray->length);
		PrintLine(ctx);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->importModule && typeClass->isInternal)
			return;

		if(!typeClass->completed)
			return;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			TranslateTypeDefinition(ctx, curr->variable->type);

		Print(ctx, "struct ");
		PrintEscapedTypeName(ctx, typeClass);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		unsigned offset = 0;
		unsigned index = 0;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
		{
			if(curr->variable->offset > offset)
				PrintIndentedLine(ctx, "char pad_%d[%d];", index, int(curr->variable->offset - offset));

			PrintIndent(ctx);

			TranslateTypeName(ctx, curr->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable);
			Print(ctx, ";");
			PrintLine(ctx);

			offset = unsigned(curr->variable->offset + curr->variable->type->size);
			index++;
		}

		if(typeClass->padding != 0)
			PrintIndentedLine(ctx, "char pad_%d[%d];", index, typeClass->padding);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeEnum *typeEnum = getType<TypeEnum>(type))
	{
		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeEnum->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(): value(0){}");
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(int v): value(v){}");
		PrintLine(ctx);

		PrintIndentedLine(ctx, "int value;");

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
}